

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_step.c
# Opt level: O3

void PDHG_Compute_Step_Size_Ratio(CUPDLPwork *pdhg)

{
  CUPDLPproblem *pCVar1;
  CUPDLPstepsize *pCVar2;
  CUPDLPiterates *pCVar3;
  CUPDLPvec *pCVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  cupdlp_float cVar9;
  cupdlp_float dDiffDual;
  cupdlp_float dDiffPrimal;
  cupdlp_float local_40;
  cupdlp_float local_38;
  
  pCVar1 = pdhg->problem;
  pCVar2 = pdhg->stepsize;
  dVar6 = pCVar2->dPrimalStep * pCVar2->dDualStep;
  pCVar3 = pdhg->iterates;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  iVar5 = pdhg->timers->nIter % 2;
  pCVar4 = pCVar3->y[iVar5];
  local_38 = 0.0;
  cupdlp_diffTwoNorm(pdhg,pCVar3->x[iVar5]->data,pCVar3->xLastRestart,pCVar1->nCols,&local_38);
  local_40 = 0.0;
  cupdlp_diffTwoNorm(pdhg,pCVar4->data,pCVar3->yLastRestart,pCVar1->nRows,&local_40);
  cVar9 = local_40;
  if (local_38 <= local_40) {
    cVar9 = local_38;
  }
  if ((double)(~-(ulong)NAN(local_38) & (ulong)cVar9 | -(ulong)NAN(local_38) & (ulong)local_40) <=
      1e-10) {
    cVar9 = pCVar2->dBeta;
  }
  else {
    dVar7 = log(local_40 / local_38);
    dVar8 = pCVar2->dBeta;
    if (dVar8 < 0.0) {
      dVar8 = sqrt(dVar8);
    }
    else {
      dVar8 = SQRT(dVar8);
    }
    dVar8 = log(dVar8);
    dVar8 = dVar8 * 0.5 + dVar7 * 0.5;
    dVar7 = exp(dVar8);
    dVar8 = exp(dVar8);
    cVar9 = dVar8 * dVar7;
    pCVar2->dBeta = cVar9;
  }
  if (cVar9 < 0.0) {
    dVar8 = sqrt(cVar9);
  }
  else {
    dVar8 = SQRT(cVar9);
  }
  pCVar2->dPrimalStep = dVar6 / dVar8;
  pCVar2->dDualStep = (dVar6 / dVar8) * pCVar2->dBeta;
  pCVar2->dTheta = 1.0;
  return;
}

Assistant:

void PDHG_Compute_Step_Size_Ratio(CUPDLPwork *pdhg) {
  CUPDLPproblem *problem = pdhg->problem;
  CUPDLPiterates *iterates = pdhg->iterates;
  CUPDLPstepsize *stepsize = pdhg->stepsize;
  cupdlp_float dMeanStepSize =
      sqrt(stepsize->dPrimalStep * stepsize->dDualStep);

  cupdlp_int iter = pdhg->timers->nIter;
  CUPDLPvec *x = iterates->x[iter % 2];
  CUPDLPvec *y = iterates->y[iter % 2];

  // cupdlp_float dDiffPrimal = cupdlp_diffTwoNorm(x, iterates->xLastRestart, problem->nCols);
  // cupdlp_float dDiffDual = cupdlp_diffTwoNorm(y, iterates->yLastRestart, problem->nRows);

  cupdlp_float dDiffPrimal = 0.0;
  cupdlp_diffTwoNorm(pdhg, x->data, iterates->xLastRestart, problem->nCols, &dDiffPrimal);
  cupdlp_float dDiffDual = 0.0;
  cupdlp_diffTwoNorm(pdhg, y->data, iterates->yLastRestart, problem->nRows, &dDiffDual);

  if (fmin(dDiffPrimal, dDiffDual) > 1e-10) {
    cupdlp_float dBetaUpdate = dDiffDual / dDiffPrimal;
    cupdlp_float dLogBetaUpdate =
        0.5 * log(dBetaUpdate) + 0.5 * log(sqrt(stepsize->dBeta));
    stepsize->dBeta = exp(dLogBetaUpdate) * exp(dLogBetaUpdate);
  }

  stepsize->dPrimalStep = dMeanStepSize / sqrt(stepsize->dBeta);
  stepsize->dDualStep = stepsize->dPrimalStep * stepsize->dBeta;
  stepsize->dTheta = 1.0;
}